

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

QString * __thiscall
QFileSystemModelPrivate::filePath
          (QString *__return_storage_ptr__,QFileSystemModelPrivate *this,QModelIndex *index)

{
  ulong uVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  QAbstractItemModel *pQVar4;
  QFileSystemNode *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QArrayData *local_98;
  QFileSystemNode *pQStack_90;
  QAbstractItemModel *local_88;
  QArrayData *local_78;
  QFileSystemNode *pQStack_70;
  QAbstractItemModel *local_68;
  QArrayDataPointer<QString> local_58;
  undefined2 local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((index->r < 0) || (index->c < 0)) || ((index->m).ptr == (QAbstractItemModel *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QString *)0x0;
    local_58.size = 0;
    local_78 = *(QArrayData **)index;
    pQStack_70 = (QFileSystemNode *)index->i;
    local_68 = (index->m).ptr;
    bVar6 = -1 < (int)local_78;
    if (((bVar6) && (-1 < (long)local_78)) && (local_68 != (QAbstractItemModel *)0x0)) {
      do {
        pQVar5 = &this->root;
        if (local_68 != (QAbstractItemModel *)0x0) {
          pQVar5 = pQStack_70;
        }
        if (pQVar5 != (QFileSystemNode *)0x0) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_58,0,&pQVar5->fileName);
        }
        if (local_68 == (QAbstractItemModel *)0x0) {
          local_98 = (QArrayData *)0xffffffffffffffff;
          pQStack_90 = (QFileSystemNode *)0x0;
          local_88 = (QAbstractItemModel *)0x0;
        }
        else {
          (**(code **)(*(long *)local_68 + 0x68))(&local_98,local_68,&local_78);
        }
        local_68 = local_88;
        local_78 = local_98;
        pQVar3 = local_78;
        pQStack_70 = pQStack_90;
        local_78._0_4_ = (int)local_98;
        bVar6 = -1 < (int)local_78;
        local_78 = pQVar3;
      } while (((bVar6) && (-1 < (long)local_98)) && (local_88 != (QAbstractItemModel *)0x0));
    }
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_3a = 0x2f;
    QtPrivate::QStringList_join((QList_conflict *)&local_98,(QChar *)&local_58,(longlong)&local_3a);
    QDir::fromNativeSeparators(__return_storage_ptr__);
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,0x10);
      }
    }
    uVar1 = (__return_storage_ptr__->d).size;
    if (2 < uVar1) {
      pDVar2 = (__return_storage_ptr__->d).d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QString::reallocData((longlong)__return_storage_ptr__,(AllocationOption)uVar1);
      }
      if (*(__return_storage_ptr__->d).ptr == L'/') {
        pDVar2 = (__return_storage_ptr__->d).d;
        if ((pDVar2 == (Data *)0x0) ||
           (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData
                    ((longlong)__return_storage_ptr__,
                     (AllocationOption)(__return_storage_ptr__->d).size);
        }
        if ((__return_storage_ptr__->d).ptr[1] == L'/') {
          QString::mid((longlong)&local_98,(longlong)__return_storage_ptr__);
          pQVar3 = &((__return_storage_ptr__->d).d)->super_QArrayData;
          pQVar5 = (QFileSystemNode *)(__return_storage_ptr__->d).ptr;
          (__return_storage_ptr__->d).d = (Data *)local_98;
          (__return_storage_ptr__->d).ptr = (char16_t *)pQStack_90;
          pQVar4 = (QAbstractItemModel *)(__return_storage_ptr__->d).size;
          (__return_storage_ptr__->d).size = (qsizetype)local_88;
          local_98 = pQVar3;
          pQStack_90 = pQVar5;
          local_88 = pQVar4;
          if (pQVar3 != (QArrayData *)0x0) {
            LOCK();
            (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar3,2,0x10);
            }
          }
        }
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemModelPrivate::filePath(const QModelIndex &index) const
{
    Q_Q(const QFileSystemModel);
    Q_UNUSED(q);
    if (!index.isValid())
        return QString();
    Q_ASSERT(index.model() == q);

    QStringList path;
    QModelIndex idx = index;
    while (idx.isValid()) {
        QFileSystemModelPrivate::QFileSystemNode *dirNode = node(idx);
        if (dirNode)
            path.prepend(dirNode->fileName);
        idx = idx.parent();
    }
    QString fullPath = QDir::fromNativeSeparators(path.join(QDir::separator()));
#if !defined(Q_OS_WIN)
    if ((fullPath.size() > 2) && fullPath[0] == u'/' && fullPath[1] == u'/')
        fullPath = fullPath.mid(1);
#else
    if (fullPath.length() == 2 && fullPath.endsWith(u':'))
        fullPath.append(u'/');
#endif
    return fullPath;
}